

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.cpp
# Opt level: O2

bool __thiscall CGI::CheckCGI(CGI *this,CharContent *cgi_string,Response *response)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t local_f8;
  vector<CharContent,_std::allocator<CharContent>_> headers_line;
  CharContent temp;
  vector<CharContent,_std::allocator<CharContent>_> local_98;
  CharContent local_80;
  CharContent local_58;
  
  sVar2 = CharContent::length(cgi_string);
  if (sVar2 == 0) {
    bVar1 = false;
  }
  else {
    headers_line.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    headers_line.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    headers_line.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = false;
    local_f8 = 0;
    do {
      sVar2 = CharContent::find(cgi_string,"\n",1,local_f8);
      if (sVar2 == cgi_string->npos) break;
      CharContent::subCharContent(&temp,cgi_string,local_f8,sVar2 - local_f8);
      CharContent::CharContent(&local_80,"\r");
      CharContent::strip(&local_58,&temp,&local_80);
      CharContent::operator=(&temp,&local_58);
      CharContent::~CharContent(&local_58);
      CharContent::~CharContent(&local_80);
      sVar3 = CharContent::length(&temp);
      if (sVar3 == 0) {
        bVar1 = true;
      }
      else {
        std::vector<CharContent,_std::allocator<CharContent>_>::push_back(&headers_line,&temp);
        local_f8 = sVar2 + 1;
      }
      CharContent::~CharContent(&temp);
    } while (sVar3 != 0);
    if (bVar1) {
      sVar3 = CharContent::length(cgi_string);
      CharContent::subCharContent(&temp,cgi_string,sVar2 + 1,sVar3 + ~sVar2);
      CharContent::operator=(&response->Entity,&temp);
      CharContent::~CharContent(&temp);
      std::vector<CharContent,_std::allocator<CharContent>_>::vector(&local_98,&headers_line);
      bVar1 = check_header(this,&local_98,response);
      std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&local_98);
    }
    else {
      bVar1 = false;
    }
    std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&headers_line);
  }
  return bVar1;
}

Assistant:

bool CGI::CheckCGI(CharContent cgi_string,Response *response){
	if(cgi_string.length()==0)
		return false;
	bool one_line_space=false;
	std::vector<CharContent> headers_line;
	size_t pos=0,start=0;
	while((pos=cgi_string.find("\n",1,start))!=cgi_string.npos){
		CharContent temp=cgi_string.subCharContent(start,pos-start);
		temp=temp.strip("\r");
		if(temp.length()==0){
			one_line_space=true;
			break;
		}
		headers_line.push_back(temp);
		start=pos+1;
	}
	if(!one_line_space)
		return false;
	response->Entity=cgi_string.subCharContent(pos+1,cgi_string.length()-pos-1);
	return this->check_header(headers_line,response);
}